

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::
evaluateCostGradient(MultipleShootingTranscription *this,VectorDynSize *gradient)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ostream *poVar4;
  pointer paVar5;
  char *pcVar6;
  ulong in_RSI;
  long *in_RDI;
  ostringstream errorMsg_1;
  ostringstream errorMsg;
  iterator mesh;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> gradientMap;
  Index nu;
  Index nx;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> costControlGradient;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> costStateGradient;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> variablesBuffer;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> controlBufferMap;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> stateBufferMap;
  DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>
  *in_stack_fffffffffffffa38;
  Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>
  *in_stack_fffffffffffffa40;
  VectorDynSize *in_stack_fffffffffffffa58;
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>
  *in_stack_fffffffffffffa60;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffa68;
  ostringstream *this_00;
  string local_4d8 [32];
  ostringstream local_4b8 [448];
  string local_2f8 [48];
  ostringstream local_2c8 [448];
  VectorDynSize *in_stack_fffffffffffffef8;
  VectorDynSize *in_stack_ffffffffffffff00;
  VectorDynSize *in_stack_ffffffffffffff08;
  double in_stack_ffffffffffffff10;
  OptimalControlProblem *in_stack_ffffffffffffff18;
  __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
  local_c0 [4];
  long local_a0;
  long local_98;
  ulong local_18;
  byte local_1;
  
  if ((*(byte *)(in_RDI + 0xb) & 1) == 0) {
    iDynTree::reportError
              ("MultipleShootingTranscription","evaluateCostGradient",
               "First you need to call the prepare method");
    local_1 = 0;
  }
  else {
    local_18 = in_RSI;
    toEigen(in_stack_fffffffffffffa58);
    toEigen(in_stack_fffffffffffffa58);
    toEigen(in_stack_fffffffffffffa58);
    toEigen(in_stack_fffffffffffffa58);
    toEigen(in_stack_fffffffffffffa58);
    local_98 = in_RDI[0x19];
    local_a0 = in_RDI[0x1a];
    uVar3 = iDynTree::VectorDynSize::size();
    uVar2 = (**(code **)(*in_RDI + 0x20))();
    if (uVar3 != uVar2) {
      (**(code **)(*in_RDI + 0x20))();
      iDynTree::VectorDynSize::resize(local_18);
    }
    toEigen(in_stack_fffffffffffffa58);
    local_c0[0]._M_current =
         (anon_struct_112_6_78b70dfe *)
         std::
         vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>
         ::begin((vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>
                  *)in_stack_fffffffffffffa38);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
                               *)in_stack_fffffffffffffa40,
                              (__normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
                               *)in_stack_fffffffffffffa38), bVar1) {
      __gnu_cxx::
      __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
      ::operator->(local_c0);
      Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>
      ::segment<long>(in_stack_fffffffffffffa68,(Index)in_stack_fffffffffffffa60,
                      (long)in_stack_fffffffffffffa58);
      Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
                ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                 in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
      __gnu_cxx::
      __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
      ::operator->(local_c0);
      Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>
      ::segment<long>(in_stack_fffffffffffffa68,(Index)in_stack_fffffffffffffa60,
                      (long)in_stack_fffffffffffffa58);
      Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
                ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                 in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
      std::
      __shared_ptr_access<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x31f716);
      __gnu_cxx::
      __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
      ::operator->(local_c0);
      bVar1 = OptimalControlProblem::costsFirstPartialDerivativeWRTState
                        (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                         in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                         in_stack_fffffffffffffef8);
      if (!bVar1) {
        this_00 = local_2c8;
        std::__cxx11::ostringstream::ostringstream(this_00);
        poVar4 = std::operator<<((ostream *)this_00,
                                 "Error while evaluating cost state gradient at time t = ");
        paVar5 = __gnu_cxx::
                 __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
                 ::operator->(local_c0);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,paVar5->time);
        std::operator<<(poVar4,".");
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError("MultipleShootingTranscription","evaluateCostGradient",pcVar6);
        std::__cxx11::string::~string(local_2f8);
        local_1 = 0;
        std::__cxx11::ostringstream::~ostringstream(local_2c8);
        goto LAB_0031fad3;
      }
      __gnu_cxx::
      __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
      ::operator->(local_c0);
      Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>
      ::segment<long>(in_stack_fffffffffffffa68,(Index)in_stack_fffffffffffffa60,
                      (long)in_stack_fffffffffffffa58);
      Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>,-1,1,false>::
      operator=(in_stack_fffffffffffffa40,
                (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)in_stack_fffffffffffffa38);
      in_stack_fffffffffffffa58 =
           (VectorDynSize *)
           std::
           __shared_ptr_access<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x31f8ba);
      __gnu_cxx::
      __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
      ::operator->(local_c0);
      bVar1 = OptimalControlProblem::costsFirstPartialDerivativeWRTControl
                        (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                         in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                         in_stack_fffffffffffffef8);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_4b8);
        poVar4 = std::operator<<((ostream *)local_4b8,
                                 "Error while evaluating cost control gradient at time t = ");
        paVar5 = __gnu_cxx::
                 __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
                 ::operator->(local_c0);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,paVar5->time);
        std::operator<<(poVar4,".");
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError("MultipleShootingTranscription","evaluateCostGradient",pcVar6);
        std::__cxx11::string::~string(local_4d8);
        local_1 = 0;
        std::__cxx11::ostringstream::~ostringstream(local_4b8);
        goto LAB_0031fad3;
      }
      paVar5 = __gnu_cxx::
               __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
               ::operator->(local_c0);
      if (paVar5->type == Control) {
        __gnu_cxx::
        __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
        ::operator->(local_c0);
        Eigen::
        DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::
        segment<long>(in_stack_fffffffffffffa68,(Index)in_stack_fffffffffffffa60,
                      (long)in_stack_fffffffffffffa58);
        Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>,-1,1,false>
        ::operator=(in_stack_fffffffffffffa40,
                    (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                     *)in_stack_fffffffffffffa38);
      }
      else {
        paVar5 = __gnu_cxx::
                 __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
                 ::operator->(local_c0);
        if (paVar5->type == State) {
          __gnu_cxx::
          __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
          ::operator->(local_c0);
          Eigen::
          DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::
          segment<long>(in_stack_fffffffffffffa68,(Index)in_stack_fffffffffffffa60,
                        (long)in_stack_fffffffffffffa58);
          Eigen::
          MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>,-1,1,false>>
          ::operator+=(in_stack_fffffffffffffa60,
                       (MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                        *)in_stack_fffffffffffffa58);
        }
      }
      __gnu_cxx::
      __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
      ::operator++(local_c0);
    }
    local_1 = 1;
  }
LAB_0031fad3:
  return (bool)(local_1 & 1);
}

Assistant:

virtual bool evaluateCostGradient(VectorDynSize& gradient) override {

                if (!(m_prepared)){
                    reportError("MultipleShootingTranscription", "evaluateCostGradient", "First you need to call the prepare method");
                    return false;
                }

                Eigen::Map<Eigen::VectorXd> stateBufferMap = toEigen(m_stateBuffer);
                Eigen::Map<Eigen::VectorXd> controlBufferMap = toEigen(m_controlBuffer);
                Eigen::Map<Eigen::VectorXd> variablesBuffer = toEigen(m_variablesBuffer);
                Eigen::Map<Eigen::VectorXd> costStateGradient = toEigen(m_costStateGradientBuffer);
                Eigen::Map<Eigen::VectorXd> costControlGradient = toEigen(m_costControlGradientBuffer);

                Eigen::Index nx = static_cast<Eigen::Index>(m_nx);
                Eigen::Index nu = static_cast<Eigen::Index>(m_nu);

                if (gradient.size() != numberOfVariables()) {
                    gradient.resize(static_cast<unsigned int>(numberOfVariables()));
                }

                Eigen::Map<Eigen::VectorXd> gradientMap = toEigen(gradient);

                for (auto mesh = m_meshPoints.begin(); mesh != m_meshPointsEnd; ++mesh){

                    stateBufferMap = variablesBuffer.segment(static_cast<Eigen::Index>(mesh->stateIndex), nx);
                    controlBufferMap = variablesBuffer.segment(static_cast<Eigen::Index>(mesh->controlIndex), nu);

                    if (!(m_ocproblem->costsFirstPartialDerivativeWRTState(mesh->time, m_stateBuffer, m_controlBuffer, m_costStateGradientBuffer))){
                        std::ostringstream errorMsg;
                        errorMsg << "Error while evaluating cost state gradient at time t = " << mesh->time << ".";
                        reportError("MultipleShootingTranscription", "evaluateCostGradient", errorMsg.str().c_str());
                        return false;
                    }

                    gradientMap.segment(static_cast<Eigen::Index>(mesh->stateIndex), nx) = costStateGradient;


                    if (!(m_ocproblem->costsFirstPartialDerivativeWRTControl(mesh->time, m_stateBuffer, m_controlBuffer, m_costControlGradientBuffer))){
                        std::ostringstream errorMsg;
                        errorMsg << "Error while evaluating cost control gradient at time t = " << mesh->time << ".";
                        reportError("MultipleShootingTranscription", "evaluateCostGradient", errorMsg.str().c_str());
                        return false;
                    }

                    if (mesh->type == MeshPointType::Control){
                        gradientMap.segment(static_cast<Eigen::Index>(mesh->controlIndex), nu) = costControlGradient;
                    } else if (mesh->type == MeshPointType::State) {
                        gradientMap.segment(static_cast<Eigen::Index>(mesh->controlIndex), nu) += costControlGradient;
                    }

                }

                return true;
            }